

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *Result,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
            is_any_ofF<char> *Pred,token_compress_mode_type eCompress)

{
  is_any_ofF<char> *this;
  is_any_ofF<char> *in_RDX;
  is_any_ofF<char> *in_RDI;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *in_stack_000001e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000001e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001f0;
  token_compress_mode_type in_stack_ffffffffffffffa4;
  is_any_ofF<char> *in_stack_ffffffffffffffa8;
  
  detail::is_any_ofF<char>::is_any_ofF(in_RDI,in_RDX);
  token_finder<boost::algorithm::detail::is_any_ofF<char>>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  this = (is_any_ofF<char> *)
         iter_split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
                   (in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
  detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::~token_finderF
            ((token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)0x192113);
  detail::is_any_ofF<char>::~is_any_ofF(this);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this;
}

Assistant:

inline SequenceSequenceT& split(
            SequenceSequenceT& Result,
            RangeT& Input,
            PredicateT Pred,
            token_compress_mode_type eCompress=token_compress_off )
        {
            return ::boost::algorithm::iter_split(
                Result,
                Input,
                ::boost::algorithm::token_finder( Pred, eCompress ) );         
        }